

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSet::spanBackUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  UnicodeSetStringSpan *this_00;
  UnicodeSetStringSpan strSpan;
  int32_t local_14c;
  UnicodeSetStringSpan local_148;
  
  local_14c = length;
  if ((0 < length) && (this->bmpSet != (BMPSet *)0x0)) {
    iVar3 = BMPSet::spanBackUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    return iVar3;
  }
  if (length < 0) {
    sVar5 = strlen(s);
    local_14c = (int32_t)sVar5;
  }
  if (local_14c == 0) {
    iVar3 = 0;
  }
  else {
    if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
      iVar3 = UnicodeSetStringSpan::spanBackUTF8
                        (this->stringSpan,(uint8_t *)s,local_14c,spanCondition);
      return iVar3;
    }
    if (this->strings->count != 0) {
      this_00 = &local_148;
      UnicodeSetStringSpan::UnicodeSetStringSpan
                (this_00,this,this->strings,0x16 - (spanCondition == USET_SPAN_NOT_CONTAINED));
      if (local_148.maxLength8 != 0) {
        uVar4 = UnicodeSetStringSpan::spanBackUTF8(&local_148,(uint8_t *)s,local_14c,spanCondition);
        this_00 = (UnicodeSetStringSpan *)(ulong)uVar4;
      }
      UnicodeSetStringSpan::~UnicodeSetStringSpan(&local_148);
      if (local_148.maxLength8 != 0) {
        return (int32_t)this_00;
      }
    }
    do {
      iVar3 = local_14c;
      lVar6 = (long)local_14c;
      local_14c = local_14c + -1;
      bVar1 = s[lVar6 + -1];
      uVar4 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar4 = utf8_prevCharSafeBody_63((uint8_t *)s,0,&local_14c,(uint)bVar1,-3);
      }
      UVar2 = contains(this,uVar4);
    } while (((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) == (int)UVar2) &&
            (iVar3 = local_14c, 0 < local_14c));
  }
  return iVar3;
}

Assistant:

int32_t UnicodeSet::spanBackUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return bmpSet->spanBackUTF8(s0, length, spanCondition);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBackUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanBackUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U8_PREV_OR_FFFD(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}